

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O2

int envy_bios_parse_extdev(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t *res_01;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  envy_bios_extdev_entry *peVar8;
  ulong uVar9;
  char *__format;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  uint8_t bytes [4];
  
  uVar2 = (bios->extdev).offset;
  if (uVar2 == 0) {
LAB_00256286:
    iVar7 = 0;
  }
  else {
    uVar3 = bios_u8(bios,(uint)uVar2,&(bios->extdev).version);
    res = &(bios->extdev).hlen;
    uVar4 = bios_u8(bios,(bios->extdev).offset + 1,res);
    res_00 = &(bios->extdev).entriesnum;
    uVar5 = bios_u8(bios,(bios->extdev).offset + 2,res_00);
    res_01 = &(bios->extdev).rlen;
    uVar6 = bios_u8(bios,(bios->extdev).offset + 3,res_01);
    uVar3 = uVar6 | uVar5 | uVar4 | uVar3;
    if (4 < (bios->extdev).hlen) {
      uVar4 = bios_u8(bios,(bios->extdev).offset + 4,&(bios->extdev).unk04);
      uVar3 = uVar3 | uVar4;
    }
    if (uVar3 != 0) {
      return -0xe;
    }
    envy_bios_block(bios,(uint)(bios->extdev).offset,
                    (uint)(bios->extdev).entriesnum * (uint)(bios->extdev).rlen +
                    (uint)(bios->extdev).hlen,"EXTDEV",-1);
    bVar12 = (bios->extdev).version;
    if ((bVar12 == 0x30) || (bVar12 == 0x40)) {
      bVar12 = *res;
      uVar9 = (ulong)bVar12;
      uVar3 = 5 - (bVar12 < 5);
      uVar11 = (ulong)uVar3;
      if (uVar3 < bVar12 || uVar3 == bVar12) {
        bVar1 = *res_01;
        if (3 < bVar1) {
          if (uVar3 < bVar12) {
            fprintf(_stderr,"EXTDEV table header longer than expected [%d > %d]\n");
            bVar1 = *res_01;
          }
          if (4 < bVar1) {
            fprintf(_stderr,"EXTDEV table record longer than expected [%d > %d]\n",(ulong)bVar1,4);
          }
          bVar12 = (bios->extdev).entriesnum;
          peVar8 = (envy_bios_extdev_entry *)calloc((ulong)bVar12,8);
          (bios->extdev).entries = peVar8;
          if (peVar8 == (envy_bios_extdev_entry *)0x0) {
            return -0xc;
          }
          for (uVar11 = 0; uVar11 < bVar12; uVar11 = uVar11 + 1) {
            peVar8 = (bios->extdev).entries;
            peVar8[uVar11].offset =
                 (ushort)(bios->extdev).rlen * (short)uVar11 +
                 (ushort)(bios->extdev).hlen + (bios->extdev).offset;
            lVar10 = 0;
            while (lVar10 != 4) {
              iVar7 = bios_u8(bios,(uint)peVar8[uVar11].offset + (int)lVar10,bytes + lVar10);
              lVar10 = lVar10 + 1;
              if (iVar7 != 0) {
                return -0xe;
              }
            }
            peVar8[uVar11].type = bytes[0];
            peVar8[uVar11].addr = bytes[1];
            peVar8[uVar11].bus = bytes[2] >> 4 & 1;
            peVar8[uVar11].unk02_0 = bytes[2] & 0xf;
            peVar8[uVar11].unk02_5 = bytes[2] >> 5;
            peVar8[uVar11].unk03 = bytes[3];
            bVar12 = *res_00;
          }
          (bios->extdev).valid = '\x01';
          goto LAB_00256286;
        }
        __format = "EXTDEV table record too short [%d < %d]\n";
        uVar11 = 4;
        uVar9 = (ulong)(uint)bVar1;
      }
      else {
        __format = "EXTDEV table header too short [%d < %d]\n";
      }
    }
    else {
      uVar9 = (ulong)(bVar12 >> 4);
      uVar11 = (ulong)(bVar12 & 0xf);
      __format = "Unknown EXTDEV table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar9,uVar11);
    iVar7 = -0x16;
  }
  return iVar7;
}

Assistant:

int envy_bios_parse_extdev (struct envy_bios *bios) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, extdev->offset, &extdev->version);
	err |= bios_u8(bios, extdev->offset+1, &extdev->hlen);
	err |= bios_u8(bios, extdev->offset+2, &extdev->entriesnum);
	err |= bios_u8(bios, extdev->offset+3, &extdev->rlen);
	if (extdev->hlen >= 5)
		err |= bios_u8(bios, extdev->offset+4, &extdev->unk04);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, extdev->offset, extdev->hlen + extdev->rlen * extdev->entriesnum, "EXTDEV", -1);
	int wanthlen = 4;
	int wantrlen = 4;
	switch (extdev->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown EXTDEV table version %d.%d\n", extdev->version >> 4, extdev->version & 0xf);
			return -EINVAL;
	}
	if (extdev->hlen >= 5)
		wanthlen = 5;
	if (extdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("EXTDEV table header too short [%d < %d]\n", extdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (extdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("EXTDEV table record too short [%d < %d]\n", extdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (extdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("EXTDEV table header longer than expected [%d > %d]\n", extdev->hlen, wanthlen);
	}
	if (extdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("EXTDEV table record longer than expected [%d > %d]\n", extdev->rlen, wantrlen);
	}
	extdev->entries = calloc(extdev->entriesnum, sizeof *extdev->entries);
	if (!extdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		entry->offset = extdev->offset + extdev->hlen + extdev->rlen * i;
		uint8_t bytes[4];
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		entry->type = bytes[0];
		entry->addr = bytes[1];
		entry->bus = bytes[2] >> 4 & 1;
		entry->unk02_0 = bytes[2] & 0xf;
		entry->unk02_5 = bytes[2] >> 5;
		entry->unk03 = bytes[3];
	}
	extdev->valid = 1;
	return 0;
}